

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::torrent::set_piece_priority
          (torrent *this,piece_index_t index,download_priority_t priority)

{
  bool bVar1;
  bool bVar2;
  element_type *peVar3;
  
  peVar3 = (this->super_torrent_hot_members).m_torrent_file.
           super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar3->m_files).m_piece_length < 1) {
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,"*** SET_PIECE_PRIORITY [ idx: %d prio: %d ignored. no metadata yet ]",
               index.m_val,(ulong)priority.m_val);
    peVar3 = (this->super_torrent_hot_members).m_torrent_file.
             super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar3->m_files).m_piece_length < 1) {
      return;
    }
  }
  bVar1 = is_seed(this);
  if ((-1 < index.m_val && !bVar1) && (index.m_val < (peVar3->m_files).m_num_pieces)) {
    need_picker(this);
    bVar1 = is_finished(this);
    bVar2 = piece_picker::set_piece_priority
                      ((this->super_torrent_hot_members).m_picker._M_t.
                       super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                       .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl,
                       index,priority);
    update_gauge(this);
    if ((bVar2) && (update_peer_interest(this,bVar1), priority.m_val == '\0')) {
      remove_time_critical_piece(this,index,false);
      return;
    }
  }
  return;
}

Assistant:

void torrent::set_piece_priority(piece_index_t const index
		, download_priority_t const priority)
	{
//		INVARIANT_CHECK;

#ifndef TORRENT_DISABLE_LOGGING
		if (!valid_metadata())
		{
			debug_log("*** SET_PIECE_PRIORITY [ idx: %d prio: %d ignored. "
				"no metadata yet ]", static_cast<int>(index)
				, static_cast<std::uint8_t>(priority));
		}
#endif
		if (!valid_metadata() || is_seed()) return;

		// this call is only valid on torrents with metadata
		if (index < piece_index_t(0) || index >= m_torrent_file->end_piece())
		{
			return;
		}

		need_picker();

		bool const was_finished = is_finished();
		bool const filter_updated = m_picker->set_piece_priority(index, priority);

		update_gauge();

		if (filter_updated)
		{
			update_peer_interest(was_finished);
#ifndef TORRENT_DISABLE_STREAMING
			if (priority == dont_download) remove_time_critical_piece(index);
#endif // TORRENT_DISABLE_STREAMING
		}

	}